

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::regexp_literal_expression::print(regexp_literal_expression *this,wostream *os)

{
  wostream *pwVar1;
  
  pwVar1 = std::operator<<(os,"regexp_literal_expression{");
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,(this->re_).pattern_._M_dataplus._M_p,
                      (this->re_).pattern_._M_string_length);
  pwVar1 = std::operator<<(pwVar1,", ");
  pwVar1 = mjs::operator<<(pwVar1,(this->re_).flags_);
  std::operator<<(pwVar1,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "regexp_literal_expression{" << re_.pattern() << ", " << re_.flags() << "}";
    }